

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O0

string * MinVR::VRDataIndex::_getTrimName(string *key,string *nameSpace)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  long lVar3;
  istream *piVar4;
  string *in_RSI;
  string *in_RDI;
  stringstream ss;
  string *trimName;
  stringstream local_1b8 [415];
  undefined1 local_19;
  string *local_10;
  
  local_19 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  lVar3 = std::__cxx11::string::find((char)local_10,0x2f);
  if (lVar3 == -1) {
    std::__cxx11::string::operator=((string *)in_RDI,local_10);
  }
  else {
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_1b8,local_10,_Var2);
    do {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b8,(string *)in_RDI,'/');
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    } while (bVar1);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return in_RDI;
}

Assistant:

std::string VRDataIndex::_getTrimName(const std::string &key,
                                     const std::string nameSpace) {

  std::string trimName;
  if (key.find('/') == std::string::npos) {
    trimName = key;

  } else {

    // This separates the key on the slashes and puts the last
    // part of it into trimName.
    std::stringstream ss(key);
    while (std::getline(ss, trimName, '/')) {};
  }

  return trimName;
}